

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O1

err_t cmdPwdRead(cmd_pwd_t *pwd,char *cmdline)

{
  bool bVar1;
  cmd_pwd_t spwd;
  bool_t bVar2;
  err_t eVar3;
  bool_t bVar4;
  int iVar5;
  u32 uVar6;
  size_t sVar7;
  char *dest;
  ulong uVar8;
  err_t eVar9;
  char *pcVar10;
  long lVar11;
  int argc;
  char **argv;
  int local_54;
  ulong local_50;
  char **local_48;
  ulong local_40;
  cmd_pwd_t local_38;
  
  bVar2 = strStartsWith(cmdline,"pass:");
  if (bVar2 == 0) {
    bVar2 = strStartsWith(cmdline,"env:");
    if (bVar2 == 0) {
      bVar2 = strStartsWith(cmdline,"share:");
      if (bVar2 == 0) {
        return 0x25b;
      }
      sVar7 = strLen("share:");
      bVar2 = 0;
      local_48 = (char **)0x0;
      local_38 = (cmd_pwd_t)0x0;
      eVar3 = cmdArgCreate(&local_54,&local_48,cmdline + sVar7);
      if (eVar3 != 0) {
        return eVar3;
      }
      if (local_54 == 0) {
        lVar11 = 0;
        local_40 = 0;
        local_50 = 0;
      }
      else {
        eVar3 = 0;
        bVar2 = 0;
        local_50 = 0;
        local_40 = 0;
        lVar11 = 0;
        while (bVar4 = strStartsWith(local_48[lVar11],"-"), bVar4 != 0) {
          bVar4 = strStartsWith(local_48[lVar11],"-t");
          pcVar10 = local_48[lVar11];
          if (bVar4 == 0) {
            bVar4 = strStartsWith(pcVar10,"-l");
            pcVar10 = local_48[lVar11];
            if (bVar4 != 0) {
              sVar7 = strLen("-l");
              if (local_50 == 0) {
                pcVar10 = pcVar10 + sVar7;
                bVar4 = decIsValid(pcVar10);
                eVar9 = 0x25b;
                if (((bVar4 == 0) || (sVar7 = decCLZ(pcVar10), sVar7 != 0)) ||
                   (sVar7 = strLen(pcVar10), sVar7 != 3)) {
                  local_50 = 0;
                }
                else {
                  uVar6 = decToU32(pcVar10);
                  local_50 = (ulong)uVar6;
                  if (0xffffff7e < uVar6 - 0x101 && (uVar6 & 0x3f) == 0) {
                    if (uVar6 != 0x80 || bVar2 == 0) {
                      local_50 = (ulong)(uVar6 >> 3);
                      goto LAB_00105a01;
                    }
                    local_50 = 0x10;
                  }
                }
                goto LAB_001058be;
              }
              goto LAB_001058b8;
            }
            bVar4 = strStartsWith(pcVar10,"-crc");
            if (bVar4 == 0) {
              iVar5 = strCmp(local_48[lVar11],"-pass");
              if (iVar5 == 0) {
                if (local_38 == (cmd_pwd_t)0x0) {
                  local_54 = local_54 + -1;
                  eVar3 = cmdPwdRead(&local_38,local_48[lVar11 + 1]);
                  if (eVar3 == 0) {
                    lVar11 = lVar11 + 2;
                    local_54 = local_54 + -1;
                    eVar3 = 0;
                    goto LAB_001058cb;
                  }
                  goto LAB_00105ade;
                }
LAB_00105ac6:
                eVar3 = 0x25c;
              }
              else {
LAB_00105ace:
                eVar3 = 0x25b;
              }
              goto LAB_00105ad4;
            }
            if (bVar2 != 0) goto LAB_00105ac6;
            if (local_50 == 0x10) goto LAB_00105ace;
            lVar11 = lVar11 + 1;
            local_54 = local_54 + -1;
            bVar2 = 1;
          }
          else {
            sVar7 = strLen("-t");
            if (local_40 == 0) {
              pcVar10 = pcVar10 + sVar7;
              bVar4 = decIsValid(pcVar10);
              eVar9 = 0x25b;
              if (((bVar4 == 0) || (sVar7 = decCLZ(pcVar10), sVar7 != 0)) ||
                 (sVar7 = strLen(pcVar10), 2 < sVar7)) {
                local_40 = 0;
                goto LAB_001058be;
              }
              uVar6 = decToU32(pcVar10);
              local_40 = (ulong)uVar6;
              if (uVar6 - 0x11 < 0xfffffff1) goto LAB_001058be;
LAB_00105a01:
              local_54 = local_54 + -1;
              lVar11 = lVar11 + 1;
              bVar1 = true;
            }
            else {
LAB_001058b8:
              eVar9 = 0x25c;
LAB_001058be:
              eVar3 = eVar9;
              bVar1 = false;
            }
            if (!bVar1) goto LAB_00105ad4;
          }
LAB_001058cb:
          if (local_54 == 0) break;
        }
      }
      spwd = local_38;
      eVar3 = 0x25b;
      if (local_38 != (cmd_pwd_t)0x0) {
        uVar8 = 2;
        if (local_40 != 0) {
          uVar8 = local_40;
        }
        if ((uVar8 <= (ulong)(long)local_54) &&
           (eVar3 = cmdFileValExist(local_54,local_48 + lVar11), eVar3 == 0)) {
          eVar3 = cmdPwdReadShare_internal(pwd,(long)local_54,local_50,bVar2,local_48 + lVar11,spwd)
          ;
        }
      }
LAB_00105ad4:
      blobClose(local_38);
LAB_00105ade:
      cmdArgClose(local_48);
      return eVar3;
    }
    sVar7 = strLen("env:");
    pcVar10 = getenv(cmdline + sVar7);
    bVar2 = strIsValid(pcVar10);
    if (pcVar10 == (char *)0x0) {
      return 0x69;
    }
    if (bVar2 == 0) {
      return 0x69;
    }
    sVar7 = strLen(pcVar10);
    dest = (char *)blobCreate(sVar7 + 1);
    *pwd = dest;
  }
  else {
    sVar7 = strLen("pass:");
    pcVar10 = cmdline + sVar7;
    sVar7 = strLen(pcVar10);
    dest = (char *)blobCreate(sVar7 + 1);
    *pwd = dest;
  }
  if (dest == (char *)0x0) {
    eVar3 = 0x6e;
  }
  else {
    strCopy(dest,pcVar10);
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

err_t cmdPwdRead(cmd_pwd_t* pwd, const char* cmdline)
{
	if (strStartsWith(cmdline, "pass:"))
		return cmdPwdReadPass(pwd, cmdline + strLen("pass:"));
	else if (strStartsWith(cmdline, "env:"))
		return cmdPwdReadEnv(pwd, cmdline + strLen("env:"));
	else if (strStartsWith(cmdline, "share:"))
		return cmdPwdReadShare(pwd, cmdline + strLen("share:"));
	return ERR_CMD_PARAMS;
}